

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperLib.c
# Opt level: O0

void Map_SuperLibFree(Map_SuperLib_t *p)

{
  Mio_Library_t *pMVar1;
  Mio_Library_t *pMVar2;
  Map_SuperLib_t *p_local;
  
  if (p != (Map_SuperLib_t *)0x0) {
    if (p->pGenlib != (Mio_Library_t *)0x0) {
      pMVar1 = p->pGenlib;
      pMVar2 = (Mio_Library_t *)Abc_FrameReadLibGen();
      if (pMVar1 != pMVar2) {
        Mio_LibraryDelete(p->pGenlib);
      }
      p->pGenlib = (Mio_Library_t *)0x0;
    }
    if (p->tTableC != (Map_HashTable_t *)0x0) {
      Map_SuperTableFree(p->tTableC);
    }
    if (p->tTable != (Map_HashTable_t *)0x0) {
      Map_SuperTableFree(p->tTable);
    }
    Extra_MmFixedStop(p->mmSupers);
    Extra_MmFixedStop(p->mmEntries);
    Extra_MmFlexStop(p->mmForms);
    if (p->ppSupers != (Map_Super_t **)0x0) {
      free(p->ppSupers);
      p->ppSupers = (Map_Super_t **)0x0;
    }
    if (p->pName != (char *)0x0) {
      free(p->pName);
      p->pName = (char *)0x0;
    }
    if (p != (Map_SuperLib_t *)0x0) {
      free(p);
    }
  }
  return;
}

Assistant:

void Map_SuperLibFree( Map_SuperLib_t * p )
{
    if ( p == NULL ) return;
    if ( p->pGenlib )
    {
        if ( p->pGenlib != Abc_FrameReadLibGen() )
            Mio_LibraryDelete( p->pGenlib );
        p->pGenlib = NULL;
    }
    if ( p->tTableC )
        Map_SuperTableFree( p->tTableC );
    if ( p->tTable )
        Map_SuperTableFree( p->tTable );
    Extra_MmFixedStop( p->mmSupers );
    Extra_MmFixedStop( p->mmEntries );
    Extra_MmFlexStop( p->mmForms );
    ABC_FREE( p->ppSupers );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}